

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_loader.cpp
# Opt level: O0

Ref<embree::SceneGraph::Node>
embree::loadOBJ(FileName *fileName,bool subdivMode,bool combineIntoSingleObject)

{
  Node *in_RDI;
  OBJLoader loader;
  bool in_stack_00000566;
  bool in_stack_00000567;
  FileName *in_stack_00000568;
  OBJLoader *in_stack_00000570;
  OBJLoader *in_stack_fffffffffffffe70;
  
  OBJLoader::OBJLoader(in_stack_00000570,in_stack_00000568,in_stack_00000567,in_stack_00000566);
  (in_RDI->super_RefCount)._vptr_RefCount = (_func_int **)in_stack_fffffffffffffe70;
  if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
    (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
  }
  OBJLoader::~OBJLoader(in_stack_fffffffffffffe70);
  return (Ref<embree::SceneGraph::Node>)in_RDI;
}

Assistant:

Ref<SceneGraph::Node> loadOBJ(const FileName& fileName, const bool subdivMode, const bool combineIntoSingleObject) {
    OBJLoader loader(fileName,subdivMode,combineIntoSingleObject); 
    return loader.group.cast<SceneGraph::Node>();
  }